

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtexture.cpp
# Opt level: O0

FTextureFormat __thiscall FPNGTexture::GetFormat(FPNGTexture *this)

{
  FPNGTexture *this_local;
  
  return TEX_RGB;
}

Assistant:

FTextureFormat FPNGTexture::GetFormat()
{
#if 0
	switch (ColorType)
	{
	case 3:		return TEX_Pal;
	case 0:		return TEX_Gray;
	default:	return TEX_RGB;
	}
#else
	// For now, create a true color texture to preserve all colors.
	return TEX_RGB;
#endif
}